

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O2

RESULT_TYPE __thiscall
duckdb::Interpolator<true>::
InterpolateInternal<duckdb::interval_t,duckdb::QuantileDirect<duckdb::interval_t>>
          (Interpolator<true> *this,interval_t *v_t,QuantileDirect<duckdb::interval_t> *accessor)

{
  undefined4 uVar1;
  undefined4 uVar2;
  QuantileCompare<duckdb::QuantileDirect<duckdb::interval_t>_> __comp;
  RESULT_TYPE RVar3;
  undefined7 uStack_17;
  
  __comp._17_7_ = uStack_17;
  __comp.desc = this->desc;
  __comp.accessor_r = accessor;
  __comp.accessor_l = accessor;
  ::std::
  nth_element<duckdb::interval_t*,duckdb::QuantileCompare<duckdb::QuantileDirect<duckdb::interval_t>>>
            (v_t + this->begin,v_t + this->FRN,v_t + this->end,__comp);
  uVar1 = v_t[this->FRN].months;
  uVar2 = v_t[this->FRN].days;
  RVar3.days = uVar2;
  RVar3.months = uVar1;
  RVar3.micros = v_t[this->FRN].micros;
  return RVar3;
}

Assistant:

typename ACCESSOR::RESULT_TYPE InterpolateInternal(INPUT_TYPE *v_t, const ACCESSOR &accessor = ACCESSOR()) const {
		QuantileCompare<ACCESSOR> comp(accessor, desc);
		std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
		return accessor(v_t[FRN]);
	}